

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandBmc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *local_a0;
  char *local_90;
  char *pLogFileName;
  int fUseSatoko;
  int iFrames;
  int fVerbose;
  int nCofFanLit;
  int fNewAlgo;
  int fRewrite;
  int nNodeDelta;
  int nBTLimitAll;
  int nBTLimit;
  int nSizeMax;
  int nFrames;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_40;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_40 = pAbc;
  _nFrames = Abc_FrameReadNtk(pAbc);
  local_90 = (char *)0x0;
  nBTLimit = 0x14;
  nBTLimitAll = 100000;
  nNodeDelta = 0;
  fRewrite = 0;
  fNewAlgo = 1000;
  nCofFanLit = 0;
  fVerbose = 1;
  iFrames = 0;
  fUseSatoko = 0;
  pLogFileName._0_4_ = 0;
  Extra_UtilGetoptReset();
LAB_00292f34:
  do {
    nSizeMax = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"FNCGDLrsvh");
    if (nSizeMax == -1) {
      if (_nFrames == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(_nFrames);
      if (iVar1 == 0) {
        Abc_Print(-1,"Currently only works for structurally hashed circuits.\n");
        return 0;
      }
      iVar1 = Abc_NtkLatchNum(_nFrames);
      if (iVar1 == 0) {
        Abc_Print(-1,"Does not work for combinational networks.\n");
        return 0;
      }
      if ((pAStack_40->fBatchMode != 0) && ((pAStack_40->Status == 0 || (pAStack_40->Status == 1))))
      {
        Abc_Print(1,"The miters is already solved; skipping the command.\n");
        return 0;
      }
      iVar1 = Abc_NtkDarBmc(_nFrames,0,nBTLimit,nBTLimitAll,fNewAlgo,0,nNodeDelta,fRewrite,
                            nCofFanLit,fVerbose,0,iFrames,fUseSatoko,
                            (int *)((long)&pLogFileName + 4),(uint)pLogFileName);
      pAStack_40->Status = iVar1;
      pAStack_40->nFrames = pLogFileName._4_4_;
      Abc_FrameReplaceCex(pAStack_40,&_nFrames->pSeqModel);
      if (local_90 != (char *)0x0) {
        Abc_NtkWriteLogFile(local_90,pAStack_40->pCex,pAStack_40->Status,pAStack_40->nFrames,"bmc");
      }
      return 0;
    }
    switch(nSizeMax) {
    case 0x43:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_002933a8;
      }
      nNodeDelta = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = nNodeDelta;
      break;
    case 0x44:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_002933a8;
      }
      fNewAlgo = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = fNewAlgo;
      break;
    default:
      goto LAB_002933a8;
    case 0x46:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_002933a8;
      }
      nBTLimit = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = nBTLimit;
      break;
    case 0x47:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
        goto LAB_002933a8;
      }
      fRewrite = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = fRewrite;
      break;
    case 0x4c:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
        goto LAB_002933a8;
      }
      local_90 = *(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00292f34;
    case 0x4e:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002933a8;
      }
      nBTLimitAll = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = nBTLimitAll;
      break;
    case 0x61:
      fVerbose = fVerbose ^ 1;
      goto LAB_00292f34;
    case 0x68:
      goto LAB_002933a8;
    case 0x72:
      nCofFanLit = nCofFanLit ^ 1;
      goto LAB_00292f34;
    case 0x73:
      pLogFileName._0_4_ = (uint)pLogFileName ^ 1;
      goto LAB_00292f34;
    case 0x76:
      fUseSatoko = fUseSatoko ^ 1;
      goto LAB_00292f34;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_002933a8:
      Abc_Print(-2,"usage: bmc [-FNC num] [-L file] [-rcsvh]\n");
      Abc_Print(-2,"\t         performs bounded model checking with static unrolling\n");
      Abc_Print(-2,"\t-F num : the number of time frames [default = %d]\n",(ulong)(uint)nBTLimit);
      Abc_Print(-2,"\t-N num : the max number of nodes in the frames [default = %d]\n",
                (ulong)(uint)nBTLimitAll);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)nNodeDelta);
      if (local_90 == (char *)0x0) {
        local_a0 = "no logging";
      }
      else {
        local_a0 = local_90;
      }
      Abc_Print(-2,"\t-L file: the log file name [default = %s]\n",local_a0);
      pcVar2 = "no";
      if (nCofFanLit != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if ((uint)pLogFileName != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle using Satoko by Bruno Schmitt [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fUseSatoko != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBmc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nFrames;
    int nSizeMax;
    int nBTLimit;
    int nBTLimitAll;
    int nNodeDelta;
    int fRewrite;
    int fNewAlgo;
    int nCofFanLit;
    int fVerbose;
    int iFrames;
    int fUseSatoko;
    char * pLogFileName = NULL;

    extern int Abc_NtkDarBmc( Abc_Ntk_t * pNtk, int nStart, int nFrames, int nSizeMax, int nNodeDelta, int nTimeOut, int nBTLimit, int nBTLimitAll, int fRewrite, int fNewAlgo, int fOrDecomp, int nCofFanLit, int fVerbose, int * piFrames, int fUseSatoko );
    // set defaults
    nFrames     =       20;
    nSizeMax    =   100000;
    nBTLimit    =        0;
    nBTLimitAll =        0;
    nNodeDelta  =     1000;
    fRewrite    =        0;
    fNewAlgo    =        1;
    nCofFanLit  =        0;
    fVerbose    =        0;
    fUseSatoko  =        0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FNCGDLrsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSizeMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimitAll = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimitAll < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nNodeDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNodeDelta < 0 )
                goto usage;
            break;
/*
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofFanLit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofFanLit < 0 )
                goto usage;
            break;
*/
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'r':
            fRewrite ^= 1;
            break;
        case 'a':
            fNewAlgo ^= 1;
            break;
        case 's':
            fUseSatoko ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Currently only works for structurally hashed circuits.\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) == 0 )
    {
        Abc_Print( -1, "Does not work for combinational networks.\n" );
        return 0;
    }
    if ( pAbc->fBatchMode && (pAbc->Status == 0 || pAbc->Status == 1) ) 
    { 
        Abc_Print( 1, "The miters is already solved; skipping the command.\n" ); 
        return 0;
    }
    pAbc->Status = Abc_NtkDarBmc( pNtk, 0, nFrames, nSizeMax, nNodeDelta, 0, nBTLimit, nBTLimitAll, fRewrite, fNewAlgo, 0, nCofFanLit, fVerbose, &iFrames, fUseSatoko );
    pAbc->nFrames = iFrames;
    Abc_FrameReplaceCex( pAbc, &pNtk->pSeqModel );
    if ( pLogFileName )
        Abc_NtkWriteLogFile( pLogFileName, pAbc->pCex, pAbc->Status, pAbc->nFrames, "bmc" );
    return 0;

usage:
    Abc_Print( -2, "usage: bmc [-FNC num] [-L file] [-rcsvh]\n" );
    Abc_Print( -2, "\t         performs bounded model checking with static unrolling\n" );
    Abc_Print( -2, "\t-F num : the number of time frames [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-N num : the max number of nodes in the frames [default = %d]\n", nSizeMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nBTLimit );
//    Abc_Print( -2, "\t-L num : the limit on fanout count of resets/enables to cofactor [default = %d]\n", nCofFanLit );
    Abc_Print( -2, "\t-L file: the log file name [default = %s]\n", pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", fRewrite? "yes": "no" );
//    Abc_Print( -2, "\t-a     : toggle SAT sweeping and SAT solving [default = %s]\n", fNewAlgo? "SAT solving": "SAT sweeping" );
    Abc_Print( -2, "\t-s     : toggle using Satoko by Bruno Schmitt [default = %s]\n", fUseSatoko? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}